

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistrhoPluginInternal.hpp
# Opt level: O2

void __thiscall DISTRHO::Plugin::PrivateData::~PrivateData(PrivateData *this)

{
  AudioPortWithBusId *pAVar1;
  Parameter *pPVar2;
  PortGroupWithId *pPVar3;
  long lVar4;
  
  pAVar1 = this->audioPorts;
  if (pAVar1 != (AudioPortWithBusId *)0x0) {
    lVar4 = *(long *)&pAVar1[-1].super_AudioPort.groupId;
    if (lVar4 != 0) {
      lVar4 = lVar4 << 6;
      do {
        AudioPort::~AudioPort((AudioPort *)((long)&pAVar1[-1].super_AudioPort.hints + lVar4));
        lVar4 = lVar4 + -0x40;
      } while (lVar4 != 0);
    }
    operator_delete__(&pAVar1[-1].super_AudioPort.groupId);
    this->audioPorts = (AudioPortWithBusId *)0x0;
  }
  pPVar2 = this->parameters;
  if (pPVar2 != (Parameter *)0x0) {
    if (*(long *)&pPVar2[-1].groupId != 0) {
      lVar4 = *(long *)&pPVar2[-1].groupId * 0xb0;
      do {
        Parameter::~Parameter((Parameter *)((long)&pPVar2[-1].hints + lVar4));
        lVar4 = lVar4 + -0xb0;
      } while (lVar4 != 0);
    }
    operator_delete__(&pPVar2[-1].groupId);
    this->parameters = (Parameter *)0x0;
  }
  pPVar3 = this->portGroups;
  if (pPVar3 != (PortGroupWithId *)0x0) {
    if (*(long *)&pPVar3[-1].groupId != 0) {
      lVar4 = *(long *)&pPVar3[-1].groupId * 0x38;
      do {
        PortGroup::~PortGroup((PortGroup *)((long)&pPVar3[-1].super_PortGroup.name.fBuffer + lVar4))
        ;
        lVar4 = lVar4 + -0x38;
      } while (lVar4 != 0);
    }
    operator_delete__(&pPVar3[-1].groupId);
    this->portGroups = (PortGroupWithId *)0x0;
  }
  if (this->bundlePath != (char *)0x0) {
    free(this->bundlePath);
    this->bundlePath = (char *)0x0;
  }
  return;
}

Assistant:

~PrivateData() noexcept
    {
#if DISTRHO_PLUGIN_NUM_INPUTS+DISTRHO_PLUGIN_NUM_OUTPUTS > 0
        if (audioPorts != nullptr)
        {
            delete[] audioPorts;
            audioPorts = nullptr;
        }
#endif

        if (parameters != nullptr)
        {
            delete[] parameters;
            parameters = nullptr;
        }

        if (portGroups != nullptr)
        {
            delete[] portGroups;
            portGroups = nullptr;
        }

#if DISTRHO_PLUGIN_WANT_PROGRAMS
        if (programNames != nullptr)
        {
            delete[] programNames;
            programNames = nullptr;
        }
#endif

#if DISTRHO_PLUGIN_WANT_STATE
        if (stateKeys != nullptr)
        {
            delete[] stateKeys;
            stateKeys = nullptr;
        }

        if (stateDefValues != nullptr)
        {
            delete[] stateDefValues;
            stateDefValues = nullptr;
        }
#endif

        if (bundlePath != nullptr)
        {
            std::free(bundlePath);
            bundlePath = nullptr;
        }
    }